

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::TypeMetaFunction::getSourceType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  bool bVar1;
  Expression *pEVar2;
  EndpointDeclaration *this_00;
  EndpointDetails *this_01;
  size_type sVar3;
  reference pvVar4;
  CompileMessage local_80;
  int local_48;
  undefined1 local_38 [8];
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  TypeMetaFunction *this_local;
  
  pEVar2 = pool_ref<soul::AST::Expression>::get(&this->source);
  bVar1 = isResolvedAsType(pEVar2);
  if (bVar1) {
    pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[5])(__return_storage_ptr__);
  }
  else {
    pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[8])
              (&types.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    bVar1 = soul::pool_ptr::operator_cast_to_bool
                      ((pool_ptr *)
                       &types.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      this_00 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                          ((pool_ptr<soul::AST::EndpointDeclaration> *)
                           &types.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_01 = EndpointDeclaration::getDetails(this_00);
      EndpointDetails::getResolvedDataTypes
                ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_38,this_01);
      sVar3 = std::vector<soul::Type,_std::allocator<soul::Type>_>::size
                        ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_38);
      if (sVar3 != 1) {
        Errors::endpointHasMultipleTypes<>();
        Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                            &local_80,false);
      }
      pvVar4 = std::vector<soul::Type,_std::allocator<soul::Type>_>::front
                         ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_38);
      Type::Type(__return_storage_ptr__,pvVar4);
      local_48 = 1;
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_38);
    }
    else {
      local_48 = 0;
    }
    pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr
              ((pool_ptr<soul::AST::EndpointDeclaration> *)
               &types.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_48 == 0) {
      pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Type getSourceType() const
        {
            if (isResolvedAsType (source.get()))
                return source->resolveAsType();

            if (auto endpoint = source->getAsEndpoint())
            {
                auto types = endpoint->getDetails().getResolvedDataTypes();

                if (types.size() == 1)
                    return types.front();

                context.throwError (Errors::endpointHasMultipleTypes());
            }

            return source->getResultType();
        }